

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O2

enable_if_t<std::is_base_of<_::acto::actor,_Console>::value,_actor_ref> __thiscall
acto::spawn<Console>(acto *this,actor_thread thread_opt)

{
  object_t *an_object;
  pointer *__ptr;
  tuple<acto::actor_*,_std::default_delete<acto::actor>_> local_28;
  __uniq_ptr_impl<acto::actor,_std::default_delete<acto::actor>_> local_20;
  actor_ref local_18;
  
  local_18.object_ = (object_t *)0x0;
  std::make_unique<Console>();
  local_20._M_t.super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
  super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl =
       (tuple<acto::actor_*,_std::default_delete<acto::actor>_>)
       (tuple<acto::actor_*,_std::default_delete<acto::actor>_>)
       local_28.super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
       super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl;
  an_object = core::make_instance(&local_18,thread_opt,
                                  (unique_ptr<acto::actor,_std::default_delete<acto::actor>_> *)
                                  &local_20);
  actor_ref::actor_ref((actor_ref *)this,an_object,false);
  if (local_20._M_t.super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
      super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
                          super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl + 8))();
  }
  local_20._M_t.super__Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>.
  super__Head_base<0UL,_acto::actor_*,_false>._M_head_impl =
       (tuple<acto::actor_*,_std::default_delete<acto::actor>_>)
       (_Tuple_impl<0UL,_acto::actor_*,_std::default_delete<acto::actor>_>)0x0;
  actor_ref::~actor_ref(&local_18);
  return (enable_if_t<std::is_base_of<_::acto::actor,_Console>::value,_actor_ref>)(object_t *)this;
}

Assistant:

inline std::enable_if_t<std::is_base_of<::acto::actor, T>::value, actor_ref>
spawn(const actor_thread thread_opt, P&&... p) {
  return actor_ref(
    core::make_instance(actor_ref(), thread_opt,
                        std::make_unique<T>(std::forward<P>(p)...)),
    false);
}